

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiWindow *pIVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined3 in_register_00000011;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  IVar5 = *r_min;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = (uint)IVar5.x;
  auVar12._4_4_ = (uint)IVar5.y;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = r_max->x;
  auVar13._4_4_ = r_max->y;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    pIVar7 = GImGui->CurrentWindow;
    IVar6 = (pIVar7->ClipRect).Min;
    auVar14._8_8_ = 0;
    auVar14._0_4_ = IVar6.x;
    auVar14._4_4_ = IVar6.y;
    auVar15._8_8_ = 0;
    auVar15._0_4_ = (pIVar7->ClipRect).Max.x;
    auVar15._4_4_ = (pIVar7->ClipRect).Max.y;
    uVar9 = vcmpps_avx512vl(auVar14,auVar12,2);
    bVar8 = (bool)((byte)uVar9 & 1);
    auVar12._0_4_ = (uint)bVar8 * (int)IVar5.x | (uint)!bVar8 * (int)IVar6.x;
    bVar8 = (bool)((byte)(uVar9 >> 1) & 1);
    auVar12._4_4_ = (uint)bVar8 * (int)IVar5.y | (uint)!bVar8 * (int)IVar6.y;
    auVar12._8_8_ = 0;
    auVar13 = vminps_avx(auVar13,auVar15);
  }
  fVar1 = (GImGui->Style).TouchExtraPadding.x;
  fVar2 = (GImGui->IO).MousePos.x;
  if (fVar2 < auVar12._0_4_ - fVar1) {
    return false;
  }
  auVar14 = vmovshdup_avx(auVar13);
  fVar3 = (GImGui->Style).TouchExtraPadding.y;
  auVar12 = vmovshdup_avx(auVar12);
  fVar4 = (GImGui->IO).MousePos.y;
  uVar10 = vcmpps_avx512vl(ZEXT416((uint)(auVar12._0_4_ - fVar3)),ZEXT416((uint)fVar4),2);
  uVar11 = vcmpps_avx512vl(ZEXT416((uint)fVar2),ZEXT416((uint)(auVar13._0_4_ + fVar1)),1);
  return (bool)(fVar4 < auVar14._0_4_ + fVar3 & (byte)uVar10 & (byte)uVar11);
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    return true;
}